

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

int __thiscall QDir::mkdir(QDir *this,char *__path,__mode_t __mode)

{
  bool bVar1;
  int iVar2;
  pointer pQVar3;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  QDirPrivate *d;
  QString fn;
  QString *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff35;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  byte local_91;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  QString *in_stack_ffffffffffffff88;
  QDir *in_stack_ffffffffffffff90;
  char local_48 [56];
  undefined8 local_10;
  long local_8;
  
  local_10 = CONCAT44(in_register_00000014,__mode);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDir *)0x28007d);
  bVar1 = QString::isEmpty((QString *)0x28008c);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (char *)this,
               CONCAT13(in_stack_ffffffffffffff37,
                        CONCAT12(in_stack_ffffffffffffff36,
                                 CONCAT11(in_stack_ffffffffffffff35,in_stack_ffffffffffffff34))),
               (char *)in_stack_ffffffffffffff28);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffff88,"QDir::mkdir: Empty or null file name");
    local_91 = 0;
  }
  else {
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    filePath(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *
                       )0x280108);
    if (bVar1) {
      pQVar3 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x2801b6);
      iVar2 = (*pQVar3->_vptr_QAbstractFileEngine[0xf])(pQVar3,&local_90,0,local_10);
      local_91 = (byte)iVar2;
    }
    else {
      QFileSystemEntry::QFileSystemEntry
                ((QFileSystemEntry *)
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,
                                   CONCAT15(in_stack_ffffffffffffff35,
                                            CONCAT14(in_stack_ffffffffffffff34,
                                                     in_stack_ffffffffffffff30)))),
                 in_stack_ffffffffffffff28);
      iVar2 = QFileSystemEngine::mkdir(local_48,(__mode_t)local_10);
      local_91 = (byte)iVar2;
      QFileSystemEntry::~QFileSystemEntry
                ((QFileSystemEntry *)
                 CONCAT17(local_91,CONCAT16(in_stack_ffffffffffffff36,
                                            CONCAT15(in_stack_ffffffffffffff35,
                                                     CONCAT14(in_stack_ffffffffffffff34,
                                                              in_stack_ffffffffffffff30)))));
    }
    local_91 = local_91 & 1;
    QString::~QString((QString *)0x280203);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_91);
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::mkdir(const QString &dirName, std::optional<QFile::Permissions> permissions) const
{
    Q_D(const QDir);

    if (dirName.isEmpty()) {
        qWarning("QDir::mkdir: Empty or null file name");
        return false;
    }

    QString fn = filePath(dirName);
    if (!d->fileEngine)
        return QFileSystemEngine::mkdir(QFileSystemEntry(fn), permissions);
    return d->fileEngine->mkdir(fn, false, permissions);
}